

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

bool __thiscall glslang::TQualifier::isParamOutput(TQualifier *this)

{
  uint uVar1;
  TQualifier *this_local;
  
  uVar1 = *(uint *)&this->field_0x8 & 0x7f;
  this_local._7_1_ = uVar1 == 0x11 || uVar1 == 0x12;
  return this_local._7_1_;
}

Assistant:

bool isParamOutput() const
    {
        switch (storage) {
        case EvqOut:
        case EvqInOut:
            return true;
        default:
            return false;
        }
    }